

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

bool __thiscall irr::gui::CGUITabControl::OnEvent(CGUITabControl *this,SEvent *event)

{
  bool bVar1;
  ulong uVar2;
  int *in_RSI;
  SEvent *in_RDI;
  s32 idx;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  uVar2 = (**(code **)(*(long *)in_RDI + 0x90))();
  if ((uVar2 & 1) != 0) {
    if (*in_RSI == 0) {
      if (in_RSI[6] == 5) {
        if (*(f64 *)(in_RSI + 2) == in_RDI[6].field_1.AccelerometerEvent.Z) {
          scrollLeft((CGUITabControl *)(ulong)in_stack_ffffffffffffffd0);
          return true;
        }
        if (*(long *)(in_RSI + 2) == *(long *)((long)&in_RDI[6].field_1 + 0x18)) {
          scrollRight((CGUITabControl *)(ulong)in_stack_ffffffffffffffd0);
          return true;
        }
      }
    }
    else if (((*in_RSI == 1) && (in_RSI[7] == 3)) &&
            (in_stack_ffffffffffffffe4 =
                  (**(code **)(*(long *)in_RDI + 0x180))(in_RDI,in_RSI[2],in_RSI[3]),
            -1 < in_stack_ffffffffffffffe4)) {
      (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,in_stack_ffffffffffffffe4);
      return true;
    }
  }
  bVar1 = IGUIElement::OnEvent
                    ((IGUIElement *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_RDI);
  return bVar1;
}

Assistant:

bool CGUITabControl::OnEvent(const SEvent &event)
{
	if (isEnabled()) {
		switch (event.EventType) {
		case EET_GUI_EVENT:
			switch (event.GUIEvent.EventType) {
			case EGET_BUTTON_CLICKED:
				if (event.GUIEvent.Caller == UpButton) {
					scrollLeft();
					return true;
				} else if (event.GUIEvent.Caller == DownButton) {
					scrollRight();
					return true;
				}

				break;
			default:
				break;
			}
			break;
		case EET_MOUSE_INPUT_EVENT:
			switch (event.MouseInput.Event) {
			// case EMIE_LMOUSE_PRESSED_DOWN:
			//	// todo: dragging tabs around
			//	return true;
			case EMIE_LMOUSE_LEFT_UP: {
				s32 idx = getTabAt(event.MouseInput.X, event.MouseInput.Y);
				if (idx >= 0) {
					setActiveTab(idx);
					return true;
				}
				break;
			}
			default:
				break;
			}
			break;
		default:
			break;
		}
	}

	return IGUIElement::OnEvent(event);
}